

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene_bsp.cpp
# Opt level: O3

void __thiscall
QGraphicsSceneBspTree::initialize(QGraphicsSceneBspTree *this,QRectF *rect,int depth)

{
  qreal qVar1;
  qreal qVar2;
  qreal qVar3;
  long in_FS_OFFSET;
  anon_union_8_2_82aba17e_for_Node_0 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  qVar1 = rect->xp;
  qVar2 = rect->yp;
  qVar3 = rect->h;
  (this->rect).w = rect->w;
  (this->rect).h = qVar3;
  (this->rect).xp = qVar1;
  (this->rect).yp = qVar2;
  this->leafCnt = 0;
  QList<QGraphicsSceneBspTree::Node>::resize
            (&this->nodes,(ulong)(uint)~(-1 << ((byte)depth + 1 & 0x1f)));
  local_48.offset = 0.0;
  uStack_40 = 0;
  QList<QGraphicsSceneBspTree::Node>::fill(&this->nodes,(parameter_type)&local_48,-1);
  QList<QList<QGraphicsItem_*>_>::resize(&this->leaves,1L << ((byte)depth & 0x3f));
  local_48.offset = 0.0;
  uStack_40 = 0;
  local_38 = 0;
  QList<QList<QGraphicsItem_*>_>::fill(&this->leaves,(parameter_type)&local_48,-1);
  if (local_48 != (anon_union_8_2_82aba17e_for_Node_0)0x0) {
    LOCK();
    *(int *)local_48 = *local_48 + -1;
    UNLOCK();
    if (*local_48 == 0) {
      QArrayData::deallocate((QArrayData *)local_48,8,0x10);
    }
  }
  initialize(this,rect,depth,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsSceneBspTree::initialize(const QRectF &rect, int depth)
{
    this->rect = rect;
    leafCnt = 0;
    nodes.resize((1 << (depth + 1)) - 1);
    nodes.fill(Node());
    leaves.resize(1ll << depth);
    leaves.fill(QList<QGraphicsItem *>());

    initialize(rect, depth, 0);
}